

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O1

uint64_t aom_mse_wxh_16bit_highbd_c(uint16_t *dst,int dstride,uint16_t *src,int sstride,int w,int h)

{
  uint64_t uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (0 < h) {
    uVar3 = 0;
    uVar1 = 0;
    do {
      if (0 < w) {
        uVar2 = 0;
        do {
          uVar1 = uVar1 + ((uint)dst[uVar2] - (uint)src[uVar2]) *
                          ((uint)dst[uVar2] - (uint)src[uVar2]);
          uVar2 = uVar2 + 1;
        } while ((uint)w != uVar2);
      }
      uVar3 = uVar3 + 1;
      src = src + sstride;
      dst = dst + dstride;
    } while (uVar3 != (uint)h);
    return uVar1;
  }
  return 0;
}

Assistant:

uint64_t aom_mse_wxh_16bit_highbd_c(uint16_t *dst, int dstride, uint16_t *src,
                                    int sstride, int w, int h) {
  uint64_t sum = 0;
  for (int i = 0; i < h; i++) {
    for (int j = 0; j < w; j++) {
      int e = dst[i * dstride + j] - src[i * sstride + j];
      sum += e * e;
    }
  }
  return sum;
}